

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

CMbuffer cm_extend_data_buf(CManager_conflict cm,CMbuffer tmp,size_t length)

{
  void *pvVar1;
  void *in_RDX;
  CMbuffer in_RSI;
  char *t;
  size_t in_stack_ffffffffffffffd8;
  CMbuffer local_8;
  
  local_8 = in_RSI;
  if ((void *)in_RSI->size < in_RDX) {
    pvVar1 = INT_CMrealloc(in_RDX,in_stack_ffffffffffffffd8);
    if (pvVar1 == (void *)0x0) {
      local_8 = (CMbuffer)0x0;
    }
    else {
      in_RSI->buffer = pvVar1;
      in_RSI->size = (size_t)in_RDX;
    }
  }
  return local_8;
}

Assistant:

extern CMbuffer
 cm_extend_data_buf(CManager cm, CMbuffer tmp, size_t length)  
 {
     (void)cm;
     if (tmp->size < length) {
	 char *t = INT_CMrealloc(tmp->buffer, length);
	 if (t == NULL) {
	     return NULL;
	 }
	 tmp->buffer = t;
	 tmp->size = length;
     }
     return tmp;
 }